

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O2

int aes_decrypt_key128(uchar *key,aes_decrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar5 = *(uint *)key;
  cx->ks[0x28] = uVar5;
  uVar6 = *(uint *)(key + 4);
  cx->ks[0x29] = uVar6;
  uVar9 = *(uint *)(key + 8);
  cx->ks[0x2a] = uVar9;
  bVar1 = key[0xf];
  bVar2 = key[0xe];
  bVar3 = key[0xd];
  bVar4 = key[0xc];
  uVar12 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18 | (uint)bVar4;
  cx->ks[0x2b] = uVar12;
  uVar7 = t_fl[1][bVar2] ^ t_fl[0][bVar3] ^ t_fl[2][bVar1] ^ t_fl[3][bVar4] ^ 1;
  uVar11 = uVar5 ^ uVar9 ^ uVar12 ^ uVar6 ^ uVar7;
  uVar7 = uVar7 ^ uVar5;
  uVar5 = t_im[1][uVar7 >> 8 & 0xff] ^ t_im[0][uVar7 & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_im[3][uVar7 >> 0x18];
  cx->ks[0x24] = uVar5;
  uVar7 = uVar7 ^ uVar6;
  uVar13 = t_im[1][uVar7 >> 8 & 0xff] ^ t_im[0][uVar7 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_im[3][uVar7 >> 0x18];
  cx->ks[0x25] = uVar13;
  uVar7 = uVar7 ^ uVar9;
  uVar14 = t_im[1][uVar7 >> 8 & 0xff] ^ t_im[0][uVar7 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_im[3][uVar7 >> 0x18];
  cx->ks[0x26] = uVar14;
  uVar7 = uVar7 ^ uVar12;
  uVar10 = t_im[1][uVar7 >> 8 & 0xff] ^ t_im[0][uVar7 & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_im[3][uVar7 >> 0x18];
  cx->ks[0x27] = uVar10;
  uVar8 = *(uint *)((long)t_fl[1] + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ t_fl[0][uVar11 >> 8 & 0xff] ^
          t_fl[2][uVar11 >> 0x18] ^ t_fl[3][uVar11 & 0xff];
  uVar7 = uVar12 ^ uVar6 ^ uVar8 ^ 2;
  uVar5 = t_im[0][(uVar8 ^ 2) & 0xff] ^ t_im[1][uVar8 >> 8 & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ t_im[3][uVar8 >> 0x18] ^ uVar5;
  cx->ks[0x20] = uVar5;
  cx->ks[0x21] = uVar5 ^ uVar13;
  uVar14 = uVar5 ^ uVar13 ^ uVar14;
  cx->ks[0x22] = uVar14;
  cx->ks[0x23] = uVar14 ^ uVar10;
  uVar6 = *(uint *)((long)t_fl[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_fl[0][uVar7 >> 8 & 0xff] ^
          t_fl[2][uVar7 >> 0x18] ^ t_fl[3][uVar7 & 0xff];
  uVar9 = uVar12 ^ uVar9 ^ uVar6 ^ 4;
  uVar15 = t_im[1][uVar6 >> 8 & 0xff] ^ t_im[0][(uVar6 ^ 4) & 0xff] ^
           *(uint *)((long)t_im[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ t_im[3][uVar6 >> 0x18];
  uVar5 = uVar5 ^ uVar15;
  cx->ks[0x1c] = uVar5;
  uVar15 = uVar15 ^ uVar13;
  cx->ks[0x1d] = uVar15;
  cx->ks[0x1e] = uVar15 ^ uVar14;
  cx->ks[0x1f] = uVar15 ^ uVar10;
  uVar6 = *(uint *)((long)t_fl[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ t_fl[0][uVar9 >> 8 & 0xff] ^
          t_fl[2][uVar9 >> 0x18] ^ t_fl[3][uVar9 & 0xff];
  uVar12 = uVar12 ^ uVar6 ^ 8;
  uVar5 = t_im[0][(uVar6 ^ 8) & 0xff] ^ t_im[1][uVar6 >> 8 & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ t_im[3][uVar6 >> 0x18] ^ uVar5;
  cx->ks[0x18] = uVar5;
  cx->ks[0x19] = uVar5 ^ uVar15;
  uVar14 = uVar14 ^ uVar5;
  cx->ks[0x1a] = uVar14;
  cx->ks[0x1b] = uVar15 ^ uVar10 ^ uVar14;
  uVar6 = *(uint *)((long)t_fl[1] + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ t_fl[0][uVar12 >> 8 & 0xff] ^
          t_fl[2][uVar12 >> 0x18] ^ t_fl[3][uVar12 & 0xff];
  uVar11 = uVar11 ^ uVar6 ^ 0x10;
  uVar8 = t_im[1][uVar6 >> 8 & 0xff] ^ t_im[0][(uVar6 ^ 0x10) & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ t_im[3][uVar6 >> 0x18];
  cx->ks[0x14] = uVar5 ^ uVar8;
  uVar15 = uVar15 ^ uVar8;
  cx->ks[0x15] = uVar15;
  cx->ks[0x16] = uVar15 ^ uVar14;
  uVar10 = uVar8 ^ uVar10;
  cx->ks[0x17] = uVar10;
  uVar6 = *(uint *)((long)t_fl[1] + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ t_fl[0][uVar11 >> 8 & 0xff] ^
          t_fl[2][uVar11 >> 0x18] ^ t_fl[3][uVar11 & 0xff];
  uVar7 = uVar7 ^ uVar6 ^ 0x20;
  uVar6 = t_im[0][(uVar6 ^ 0x20) & 0xff] ^ t_im[1][uVar6 >> 8 & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ t_im[3][uVar6 >> 0x18] ^
          uVar5 ^ uVar8;
  cx->ks[0x10] = uVar6;
  cx->ks[0x11] = uVar6 ^ uVar15;
  uVar14 = uVar14 ^ uVar6;
  cx->ks[0x12] = uVar14;
  cx->ks[0x13] = uVar14 ^ uVar10;
  uVar5 = *(uint *)((long)t_fl[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_fl[0][uVar7 >> 8 & 0xff] ^
          t_fl[2][uVar7 >> 0x18] ^ t_fl[3][uVar7 & 0xff];
  uVar9 = uVar9 ^ uVar5 ^ 0x40;
  uVar8 = t_im[1][uVar5 >> 8 & 0xff] ^ t_im[0][(uVar5 ^ 0x40) & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ t_im[3][uVar5 >> 0x18];
  uVar6 = uVar6 ^ uVar8;
  cx->ks[0xc] = uVar6;
  uVar8 = uVar8 ^ uVar15;
  cx->ks[0xd] = uVar8;
  cx->ks[0xe] = uVar8 ^ uVar14;
  cx->ks[0xf] = uVar8 ^ uVar10;
  uVar5 = *(uint *)((long)t_fl[1] + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ t_fl[0][uVar9 >> 8 & 0xff] ^
          t_fl[2][uVar9 >> 0x18] ^ t_fl[3][uVar9 & 0xff];
  uVar12 = uVar12 ^ uVar5 ^ 0x80;
  uVar6 = t_im[0][(uVar5 ^ 0x80) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ t_im[3][uVar5 >> 0x18] ^ uVar6;
  cx->ks[8] = uVar6;
  cx->ks[9] = uVar6 ^ uVar8;
  uVar14 = uVar14 ^ uVar6;
  cx->ks[10] = uVar14;
  cx->ks[0xb] = uVar8 ^ uVar10 ^ uVar14;
  uVar5 = *(uint *)((long)t_fl[1] + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ t_fl[0][uVar12 >> 8 & 0xff] ^
          t_fl[2][uVar12 >> 0x18] ^ t_fl[3][uVar12 & 0xff];
  uVar11 = uVar11 ^ uVar5 ^ 0x1b;
  uVar5 = t_im[1][uVar5 >> 8 & 0xff] ^ t_im[0][(uVar5 ^ 0x1b) & 0xff] ^
          *(uint *)((long)t_im[2] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ t_im[3][uVar5 >> 0x18];
  cx->ks[4] = uVar6 ^ uVar5;
  cx->ks[5] = uVar8 ^ uVar5;
  cx->ks[6] = uVar8 ^ uVar5 ^ uVar14;
  cx->ks[7] = uVar5 ^ uVar10;
  uVar7 = t_fl[0][uVar11 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar11 >> 0x18] ^ t_fl[3][uVar11 & 0xff] ^ 0x36 ^ uVar7;
  cx->ks[0] = uVar9 ^ uVar12 ^ uVar11 ^ uVar7;
  cx->ks[1] = uVar12 ^ uVar7;
  cx->ks[2] = uVar11 ^ uVar7;
  cx->ks[3] = uVar7;
  (cx->inf).l = 0xa0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(decrypt_key128)(const unsigned char *key, aes_decrypt_ctx cx[1])
{   uint32_t    ss[5];
#if defined( d_vars )
        d_vars;
#endif

	cx->ks[v(40,(0))] = ss[0] = word_in(key, 0);
    cx->ks[v(40,(1))] = ss[1] = word_in(key, 1);
    cx->ks[v(40,(2))] = ss[2] = word_in(key, 2);
    cx->ks[v(40,(3))] = ss[3] = word_in(key, 3);

#ifdef DEC_KS_UNROLL
     kdf4(cx->ks, 0); kd4(cx->ks, 1);
     kd4(cx->ks, 2);  kd4(cx->ks, 3);
     kd4(cx->ks, 4);  kd4(cx->ks, 5);
     kd4(cx->ks, 6);  kd4(cx->ks, 7);
     kd4(cx->ks, 8);  kdl4(cx->ks, 9);
#else
    {   uint32_t i;
        for(i = 0; i < 10; ++i)
            k4e(cx->ks, i);
#if !(DEC_ROUND == NO_TABLES)
        for(i = N_COLS; i < 10 * N_COLS; ++i)
            cx->ks[i] = inv_mcol(cx->ks[i]);
#endif
    }
#endif
    cx->inf.l = 0;
    cx->inf.b[0] = 10 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}